

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8Wrap.c
# Opt level: O2

void XUtf8_measure_extents
               (Display *display,Drawable d,XUtf8FontStruct *font_set,GC gc,int *xx,int *yy,int *ww,
               int *hh,char *string,int num_bytes)

{
  int iVar1;
  int enc;
  int *piVar2;
  int *piVar3;
  XFontStruct **ppXVar4;
  unsigned_short uVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  uint ucs_00;
  long lVar12;
  char glyph [2];
  int local_1c0;
  int local_1bc;
  int local_1b4;
  int local_1b0;
  uint ucs;
  int fnt_dsc;
  int fnt_asc;
  int dir_ret;
  XCharStruct sizes;
  XChar2b buf [128];
  
  dir_ret = 0;
  fnt_asc = 0;
  fnt_dsc = 0;
  iVar1 = font_set->nb_font;
  lVar12 = (long)iVar1;
  if (0 < lVar12) {
    local_1b0 = num_bytes;
    piVar2 = font_set->ranges;
    piVar3 = font_set->encodings;
    ppXVar4 = font_set->fonts;
    for (lVar10 = 0; lVar12 != lVar10; lVar10 = lVar10 + 1) {
      if (ppXVar4[lVar10] != (XFontStruct *)0x0) {
        local_1bc = 0x7fffffff;
        iVar6 = 0;
        local_1b4 = 0;
        local_1c0 = 0;
        lVar11 = lVar10;
        do {
          iVar9 = (int)lVar11;
          if (local_1b0 < 1) {
            XSetFont(display,gc,ppXVar4[iVar9]->fid);
            XTextExtents16(ppXVar4[iVar9],buf,iVar6,&dir_ret,&fnt_asc,&fnt_dsc,&sizes);
            iVar6 = (int)sizes.ascent;
            iVar1 = sizes.descent + iVar6;
            if (sizes.descent + iVar6 <= local_1c0) {
              iVar1 = local_1c0;
            }
            iVar9 = -iVar6;
            if (SBORROW4(local_1bc,-iVar6) != local_1bc + iVar6 < 0) {
              iVar9 = local_1bc;
            }
            *ww = local_1b4 + sizes.width;
            *hh = iVar1;
            *xx = 0;
            *yy = iVar9;
            return;
          }
          if (0x78 < iVar6) {
            XSetFont(display,gc,ppXVar4[iVar9]->fid);
            XTextExtents16(ppXVar4[iVar9],buf,iVar6,&dir_ret,&fnt_asc,&fnt_dsc,&sizes);
            local_1b4 = local_1b4 + sizes.width;
            iVar6 = (int)sizes.ascent;
            if (local_1c0 < sizes.descent + iVar6) {
              local_1c0 = sizes.descent + iVar6;
            }
            if (SBORROW4(local_1bc,-iVar6) == local_1bc + iVar6 < 0) {
              local_1bc = -iVar6;
            }
            iVar6 = 0;
          }
          uVar7 = XFastConvertUtf8ToUcs((uchar *)string,local_1b0,&ucs);
          if ((int)uVar7 < 2) {
            uVar7 = 1;
          }
          uVar5 = XUtf8IsNonSpacing(ucs);
          lVar11 = lVar10;
          ucs_00 = ucs;
          if (uVar5 != 0) {
            ucs = (uint)uVar5;
            ucs_00 = (uint)uVar5;
          }
          for (; lVar12 != lVar11; lVar11 = lVar11 + 1) {
            if (ppXVar4[lVar11] != (XFontStruct *)0x0) {
              enc = piVar3[lVar11];
              iVar8 = ucs2fontmap(glyph,ucs_00,enc);
              if ((-1 < iVar8) &&
                 ((enc != 0 ||
                  ((piVar2[lVar11 * 2] <= (int)ucs_00 && ((int)ucs_00 <= piVar2[lVar11 * 2 + 1])))))
                 ) {
                if (iVar1 != (int)lVar11) goto LAB_001f5e50;
                break;
              }
            }
          }
          ucs2fontmap(glyph,0x3f,piVar3[lVar10]);
          lVar11 = lVar10;
LAB_001f5e50:
          if ((uVar5 == 0) && (iVar9 == (int)lVar11)) {
            buf[iVar6].byte1 = glyph[0];
            buf[iVar6].byte2 = glyph[1];
            iVar6 = iVar6 + 1;
          }
          else {
            XSetFont(display,gc,ppXVar4[iVar9]->fid);
            XTextExtents16(ppXVar4[iVar9],buf,iVar6,&dir_ret,&fnt_asc,&fnt_dsc,&sizes);
            local_1b4 = local_1b4 + sizes.width;
            iVar9 = (int)sizes.ascent;
            iVar6 = sizes.descent + iVar9;
            if (sizes.descent + iVar9 <= local_1c0) {
              iVar6 = local_1c0;
            }
            local_1c0 = iVar6;
            iVar6 = -iVar9;
            if (SBORROW4(local_1bc,-iVar9) != local_1bc + iVar9 < 0) {
              iVar6 = local_1bc;
            }
            local_1bc = iVar6;
            buf[0].byte1 = glyph[0];
            buf[0].byte2 = glyph[1];
            if (uVar5 != 0) {
              iVar6 = XTextWidth16(ppXVar4[(int)lVar11],buf,1);
              local_1b4 = local_1b4 - iVar6;
            }
            iVar6 = 1;
          }
          string = (char *)((uchar *)string + uVar7);
          local_1b0 = local_1b0 - uVar7;
        } while( true );
      }
    }
  }
  return;
}

Assistant:

void
XUtf8_measure_extents(
        Display         	*display,
        Drawable        	d,
        XUtf8FontStruct  *font_set,
        GC              	gc,
        int             	*xx,     /* x-offset from origin */
        int             	*yy,     /* y-offset from origin */
        int             	*ww,     /* overall inked width  */
        int             	*hh,     /* maximum inked height */
        const char      	*string, /* text to measure */
        int             	num_bytes) {
  int 		*encodings; /* encodings array */
  XFontStruct 	**fonts;    /* fonts array */
  Fl_XChar2b 	buf[128];   /* drawing buffer */
  int 		fnum;       /* index of the current font in the fonts array*/
  int 		i;          /* current byte in the XChar2b buffer */
  int 		first;      /* first valid font index */
  int 		last_fnum;  /* font index of the previous char */
  int 		nb_font;    /* quantity of fonts in the font array */
  char 		glyph[2];   /* byte1 and byte2 value of the UTF-8 char */
  int		*ranges;    /* sub range of iso10646 */

  int wd = 0; /* accumulates the width of the text */
  int ht = 0; /* used to find max height in text */
  int hs;     /* "height sum" of current text segment */
  int yt = 0x7FFFFFFF; /* used to find bounding rectangle delta-y */
  /* int res; */ /* result from calling XTextExtents16() - we should test this is OK! */
  /* FC: the man does not specify error codes for it, but X will generate X errors like BadGC or BadFont. */

  XCharStruct sizes;
  int dir_ret = 0;
  int fnt_asc = 0;
  int fnt_dsc = 0;

  nb_font = font_set->nb_font;

  if (nb_font < 1) {
    /* there is no font in the font_set :-( */
    return;
  }
  ranges = font_set->ranges;
  fonts = font_set->fonts;
  encodings = font_set->encodings;
  i = 0;
  fnum = 0;

  while(fnum < nb_font && !fonts[fnum]) fnum++;
  if (fnum >= nb_font) {
    /* there is no valid font for the X server */
    return;
  }

  first = fnum;
  last_fnum = fnum;

  while (num_bytes > 0) {
    int 	 ulen;   /* byte length of the UTF-8 char */
    unsigned int ucs;    /* Unicode value of the UTF-8 char */
    unsigned int no_spc; /* Spacing char equivalent of a non-spacing char */

    if (i > 120) {
      /*** draw the buffer **/
      XSetFont(display, gc, fonts[fnum]->fid);
      /* res = */ XTextExtents16(fonts[fnum], buf, i, &dir_ret, &fnt_asc, &fnt_dsc, &sizes);
      /* recover the dimensions - should verify that res == 0 first! */
      wd += sizes.width; /* accumulate the width */
      hs = sizes.ascent + sizes.descent; /* total height */
      if(hs > ht) ht = hs; /* new height exceeds previous height */
      if(yt > (-sizes.ascent)) yt = -sizes.ascent; /* delta y offset */
      i = 0;
    }

    ulen = XFastConvertUtf8ToUcs((const unsigned char*)string, num_bytes, &ucs);

    if (ulen < 1) ulen = 1;

    no_spc = XUtf8IsNonSpacing(ucs);
    if (no_spc) ucs = no_spc;

    /*
     * find the first encoding which can be used to
     * draw the glyph
     */
    fnum = first;
    while (fnum < nb_font) {
      if (fonts[fnum] && ucs2fontmap(glyph, ucs, encodings[fnum]) >= 0) {
	if (encodings[fnum] != 0 ||
	    ((int)ucs >= ranges[fnum * 2] &&
	     (int)ucs <= ranges[fnum * 2 + 1])) {
	  break;
	}
      }
      fnum++;
    }
    if (fnum == nb_font) {
      /* the char is not valid in all encodings ->
       * draw it using the first font :-(
       */
      fnum = first;
      ucs2fontmap(glyph, '?', encodings[fnum]);
    }

    if (last_fnum != fnum || no_spc) {
      XSetFont(display, gc, fonts[last_fnum]->fid);
      /* res = */ XTextExtents16(fonts[last_fnum], buf, i, &dir_ret, &fnt_asc, &fnt_dsc, &sizes);
      /* recover the dimensions - should verify that res == 0 first! */
      wd += sizes.width; /* accumulate the width */
      hs = sizes.ascent + sizes.descent; /* total height */
      if(hs > ht) ht = hs; /* new height exceeds previous height */
      if(yt > (-sizes.ascent)) yt = -sizes.ascent; /* delta y offset */
      i = 0;
      (*buf).byte1 = glyph[0];
      (*buf).byte2 = glyph[1];
      if (no_spc) {
	wd -= XTextWidth16(fonts[fnum], buf, 1);
      }
    } else {
      (*(buf + i)).byte1 = glyph[0];
      (*(buf + i)).byte2 = glyph[1];
    }
    last_fnum = fnum;
    i++;
    string += ulen;
    num_bytes -= ulen;
  }

  XSetFont(display, gc, fonts[fnum]->fid);
  /* res = */ XTextExtents16(fonts[fnum], buf, i, &dir_ret, &fnt_asc, &fnt_dsc, &sizes);
  /* recover the dimensions - should verify that res == 0 first! */
  wd += sizes.width; /* accumulate the width */
  hs = sizes.ascent + sizes.descent; /* total height */
  if(hs > ht) ht = hs; /* new height exceeds previous height */
  if(yt > (-sizes.ascent)) yt = -sizes.ascent; /* delta y offset */
  /* return values */
  *ww = wd; /* width of inked area rectangle */
  *hh = ht; /* max height of inked area rectangle */
  *xx = 0;  /* x-offset from origin to start of inked area - this is wrong! */
  *yy = yt; /* y-offset from origin to start of inked rectangle */
}